

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O0

bool __thiscall
ASDCP::MXF::FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_>::Unarchive
          (FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_> *this,MemIOReader *Reader)

{
  bool bVar1;
  ui32_t uVar2;
  byte local_69;
  undefined1 local_50 [8];
  value_type tmp_item;
  ui32_t i;
  uint uStack_24;
  bool result;
  ui32_t item_size;
  ui32_t item_count;
  MemIOReader *Reader_local;
  FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_> *this_local;
  
  _item_size = Reader;
  Reader_local = (MemIOReader *)this;
  bVar1 = Kumu::MemIOReader::ReadUi32BE(Reader,&stack0xffffffffffffffdc);
  if (bVar1) {
    bVar1 = Kumu::MemIOReader::ReadUi32BE(_item_size,&i);
    if (bVar1) {
      if ((uStack_24 == 0) || (uVar2 = ItemSize(this), uVar2 == i)) {
        tmp_item.super_Identifier<16U>._31_1_ = 1;
        tmp_item.super_Identifier<16U>.m_Value[0xf] = '\0';
        tmp_item.super_Identifier<16U>._25_3_ = 0;
        while( true ) {
          local_69 = 0;
          if ((uint)tmp_item.super_Identifier<16U>._24_4_ < uStack_24) {
            local_69 = tmp_item.super_Identifier<16U>._31_1_;
          }
          if ((local_69 & 1) == 0) break;
          Kumu::UUID::UUID((UUID *)local_50);
          tmp_item.super_Identifier<16U>._31_1_ =
               Kumu::Identifier<16U>::Unarchive((Identifier<16U> *)local_50,_item_size);
          if ((bool)tmp_item.super_Identifier<16U>._31_1_) {
            PushSet<Kumu::UUID>::push_back(&this->super_PushSet<Kumu::UUID>,(UUID *)local_50);
          }
          Kumu::UUID::~UUID((UUID *)local_50);
          tmp_item.super_Identifier<16U>._24_4_ = tmp_item.super_Identifier<16U>._24_4_ + 1;
        }
        this_local._7_1_ = (bool)(tmp_item.super_Identifier<16U>._31_1_ & 1);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Unarchive(Kumu::MemIOReader* Reader) {
	    ui32_t item_count, item_size;
	    if ( ! Reader->ReadUi32BE(&item_count) ) return false;
	    if ( ! Reader->ReadUi32BE(&item_size) ) return false;

	    if ( item_count > 0 )
	      {
		if ( this->ItemSize() != item_size ) return false;
	      }

	    bool result = true;
	    for ( ui32_t i = 0; i < item_count && result; ++i )
	      {
		typename ContainerType::value_type tmp_item;
		result = tmp_item.Unarchive(Reader);

		if ( result )
		  {
		    this->push_back(tmp_item);
		  }
	      }

	    return result;
	  }